

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csat_apis.c
# Opt level: O2

void ABC_Network_Finalize(ABC_Manager mng)

{
  Abc_Ntk_t *pAVar1;
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  int iVar4;
  
  pAVar1 = mng->pNtk;
  for (iVar4 = 0; iVar4 < pAVar1->vPis->nSize; iVar4 = iVar4 + 1) {
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(pAVar1->vPis,iVar4);
    pcVar3 = ABC_GetNodeName(mng,pAVar2);
    Abc_ObjAssignName(pAVar2,pcVar3,(char *)0x0);
  }
  for (iVar4 = 0; iVar4 < pAVar1->vPos->nSize; iVar4 = iVar4 + 1) {
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(pAVar1->vPos,iVar4);
    pcVar3 = ABC_GetNodeName(mng,pAVar2);
    Abc_ObjAssignName(pAVar2,pcVar3,(char *)0x0);
  }
  if (pAVar1->nObjCounts[8] == 0) {
    return;
  }
  __assert_fail("Abc_NtkLatchNum(pNtk) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/csat/csat_apis.c"
                ,0x13d,"void ABC_Network_Finalize(ABC_Manager)");
}

Assistant:

void ABC_Network_Finalize( ABC_Manager mng )
{
    Abc_Ntk_t * pNtk = mng->pNtk;
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_ObjAssignName( pObj, ABC_GetNodeName(mng, pObj), NULL );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_ObjAssignName( pObj, ABC_GetNodeName(mng, pObj), NULL );
    assert( Abc_NtkLatchNum(pNtk) == 0 );
}